

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall QFSFileEngine::isRelativePath(QFSFileEngine *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath
            (&local_28,(QFileSystemEntry *)((this->super_QAbstractFileEngine).d_ptr.d + 1));
  if ((undefined1 *)local_28.d.size == (undefined1 *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = *local_28.d.ptr != L'/';
  }
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::isRelativePath() const
{
    Q_D(const QFSFileEngine);
    const QString fp = d->fileEntry.filePath();
    return fp.isEmpty() || fp.at(0) != u'/';
}